

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O3

void __thiscall Parse::SMTLIB2::readAssert(SMTLIB2 *this,LExpr *body)

{
  List<Kernel::Unit_*> *pLVar1;
  bool bVar2;
  Unit *this_00;
  List<Kernel::Unit_*> *pLVar3;
  undefined8 *puVar4;
  long *plVar5;
  SplitSet **ppSVar6;
  long *plVar7;
  FIFO *pFVar8;
  Formula *fla;
  ParseResult res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  Formula *in_stack_fffffffffffffeb0;
  SplitSet **local_148;
  long lStack_140;
  SplitSet *local_138;
  void *pvStack_130;
  void *local_128;
  float fStack_120;
  float fStack_11c;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  Inference local_98;
  ParseResult local_60;
  
  this->_nextVar = 0;
  parseTermOrFormula(&local_60,this,body,false);
  bVar2 = ParseResult::asFormula(&local_60,(Formula **)&stack0xfffffffffffffeb0);
  if (bVar2) {
    this_00 = (Unit *)::operator_new(0x48,8);
    local_d8._M_dataplus._M_p._0_1_ = 1;
    Kernel::Inference::Inference((Inference *)&local_148,(FromInput *)&local_d8);
    local_98._ptr2 = local_128;
    local_98.th_ancestors = fStack_120;
    local_98.all_ancestors = fStack_11c;
    local_98._splits = local_138;
    local_98._ptr1 = pvStack_130;
    local_98._0_8_ = local_148;
    local_98._8_8_ = lStack_140;
    Kernel::Unit::Unit(this_00,FORMULA,&local_98);
    *(Formula **)(this_00 + 1) = in_stack_fffffffffffffeb0;
    *(undefined8 *)&this_00[1]._inference = 3;
    Kernel::Unit::doUnitTracing(this_00);
    pLVar3 = (List<Kernel::Unit_*> *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar3->_head = this_00;
    pLVar3->_tail = (List<Kernel::Unit_*> *)0x0;
    pLVar1 = (this->_formulas)._last;
    pFVar8 = (FIFO *)&pLVar1->_tail;
    if (pLVar1 == (List<Kernel::Unit_*> *)0x0) {
      pFVar8 = &this->_formulas;
    }
    pFVar8->_first = pLVar3;
    (this->_formulas)._last = pLVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.label._M_dataplus._M_p != &local_60.label.field_2) {
      operator_delete(local_60.label._M_dataplus._M_p,
                      local_60.label.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_118,body,true);
  std::operator+(&local_d8,"Asserted expression of non-boolean sort ",&local_118);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_148 = (SplitSet **)*plVar5;
  ppSVar6 = (SplitSet **)(plVar5 + 2);
  if (local_148 == ppSVar6) {
    local_138 = *ppSVar6;
    pvStack_130 = (void *)plVar5[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *ppSVar6;
  }
  lStack_140 = plVar5[1];
  *plVar5 = (long)ppSVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_b8,this->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_f8 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_f8 == plVar7) {
    local_e8 = *plVar7;
    uStack_e0 = (undefined4)plVar5[3];
    uStack_dc = *(undefined4 *)((long)plVar5 + 0x1c);
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar7;
  }
  local_f0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  *puVar4 = &PTR_cry_00b3dfc0;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar4 + 1),local_f8,local_f0 + (long)local_f8);
  *puVar4 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar4 + 5) = 0;
  puVar4[6] = puVar4 + 8;
  puVar4[7] = 0;
  *(undefined1 *)(puVar4 + 8) = 0;
  __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

void SMTLIB2::readAssert(LExpr* body)
{
  _nextVar = 0;
  ASS(_scopes.isEmpty());

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  Formula* fla;
  if (!res.asFormula(fla)) {
    USER_ERROR_EXPR("Asserted expression of non-boolean sort "+body->toString());
  }

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));
  _formulas.pushBack(fu);
}